

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

long ply_set_read_cb(p_ply ply,char *element_name,char *property_name,p_ply_read_cb read_cb,
                    void *pdata,long idata)

{
  p_ply_element name;
  p_ply_property ptVar1;
  p_ply_read_cb in_RCX;
  void *in_R8;
  p_ply in_R9;
  p_ply_property property;
  p_ply_element element;
  long local_8;
  
  name = ply_find_element(in_R9,(char *)0x0);
  if (name == (p_ply_element)0x0) {
    local_8 = 0;
  }
  else {
    ptVar1 = ply_find_property((p_ply_element)in_R9,name->name);
    if (ptVar1 == (p_ply_property)0x0) {
      local_8 = 0;
    }
    else {
      ptVar1->read_cb = in_RCX;
      ptVar1->pdata = in_R8;
      ptVar1->idata = (long)in_R9;
      local_8 = (long)(int)name->ninstances;
    }
  }
  return local_8;
}

Assistant:

long ply_set_read_cb(p_ply ply, const char *element_name,
        const char* property_name, p_ply_read_cb read_cb,
        void *pdata, long idata) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && element_name && property_name);
    element = ply_find_element(ply, element_name);
    if (!element) return 0;
    property = ply_find_property(element, property_name);
    if (!property) return 0;
    property->read_cb = read_cb;
    property->pdata = pdata;
    property->idata = idata;
    return (int) element->ninstances;
}